

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O3

void __thiscall HEkkDualRHS::createInfeasList(HEkkDualRHS *this,double columnDensity)

{
  int iVar1;
  pointer pdVar2;
  HEkk *pHVar3;
  pointer pcVar4;
  pointer pdVar5;
  pointer piVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  size_t __n;
  int iVar10;
  long lVar11;
  HighsInt *pHVar12;
  int iVar13;
  HighsInt iRow;
  size_t sVar14;
  HighsInt iRow_1;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar1 = (this->ekk_instance_->lp_).num_row_;
  __n = (size_t)iVar1;
  pdVar2 = (this->ekk_instance_->scattered_dual_edge_weight_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((long)__n < 1) {
    this->workCount = 0;
    this->workCutoff = 0.0;
    iVar8 = 0;
  }
  else {
    sVar14 = 0;
    memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__n);
    this->workCount = 0;
    this->workCutoff = 0.0;
    do {
      dVar17 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar14];
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[sVar14] = '\x01';
        iVar8 = this->workCount;
        this->workCount = iVar8 + 1;
        (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = (int)sVar14;
      }
      sVar14 = sVar14 + 1;
    } while (__n != sVar14);
    iVar8 = this->workCount;
  }
  pHVar12 = &this->workCount;
  dVar17 = (double)iVar8;
  if (columnDensity < 0.05) {
    dVar15 = (double)iVar1 * 0.01;
    dVar16 = 500.0;
    if (500.0 <= dVar15) {
      dVar16 = dVar15;
    }
    if (dVar16 < dVar17) {
      pHVar3 = this->ekk_instance_;
      dVar16 = 500.0;
      if (500.0 <= dVar17 * 0.001) {
        dVar16 = dVar17 * 0.001;
      }
      iVar13 = (int)dVar16;
      if (iVar1 < 1) {
        dVar17 = 0.0;
      }
      else {
        pcVar4 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar14 = 0;
        iVar10 = 0;
        dVar16 = 0.0;
        do {
          dVar17 = dVar16;
          if (pcVar4[sVar14] != '\0') {
            dVar15 = pdVar5[sVar14] /
                     (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar14];
            dVar17 = dVar15;
            if (dVar15 <= dVar16) {
              dVar17 = dVar16;
            }
            lVar11 = (long)iVar10;
            iVar10 = iVar10 + 1;
            pdVar2[lVar11] = -dVar15;
          }
          sVar14 = sVar14 + 1;
          dVar16 = dVar17;
        } while (__n != sVar14);
        dVar17 = dVar17 * 0.99999;
      }
      lVar11 = (long)iVar13;
      if ((iVar8 != 0) && (iVar8 != iVar13)) {
        uVar9 = (ulong)iVar8;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::__introselect<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar2,pdVar2 + lVar11,pdVar2 + uVar9,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      }
      dVar16 = pdVar2[lVar11];
      dVar15 = dVar16 * -1.00001;
      if (dVar17 <= dVar15) {
        dVar15 = dVar17;
      }
      this->workCutoff = dVar15;
      if (iVar1 < 1) {
        *pHVar12 = 0;
        iVar8 = 0;
      }
      else {
        sVar14 = 0;
        memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0,__n);
        this->workCount = 0;
        do {
          if ((pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar14] * this->workCutoff <=
              (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[sVar14]) {
            iVar8 = this->workCount;
            this->workCount = iVar8 + 1;
            (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8] = (int)sVar14;
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[sVar14] = '\x01';
          }
          sVar14 = sVar14 + 1;
        } while (__n != sVar14);
        iVar8 = *pHVar12;
      }
      dVar17 = (double)iVar8;
      if (((double)iVar13 * 1.5 < (double)iVar8) &&
         (*pHVar12 = iVar13, dVar17 = (double)iVar13, iVar13 < iVar8)) {
        do {
          piVar6 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = piVar6[lVar11];
          if ((this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar13] <=
              (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar13] * -dVar16) {
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar13] = '\0';
          }
          else {
            iVar10 = *pHVar12;
            *pHVar12 = iVar10 + 1;
            piVar6[iVar10] = iVar13;
          }
          lVar11 = lVar11 + 1;
        } while (iVar8 != lVar11);
        dVar17 = (double)*pHVar12;
      }
    }
  }
  if ((double)iVar1 * 0.2 < dVar17) {
    *pHVar12 = -iVar1;
    this->workCutoff = 0.0;
  }
  return;
}

Assistant:

void HEkkDualRHS::createInfeasList(double columnDensity) {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  double* dwork = ekk_instance_.scattered_dual_edge_weight_.data();

  // 1. Build the full list
  fill_n(workMark.data(), numRow, 0);
  workCount = 0;
  workCutoff = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (work_infeasibility[iRow]) {
      workMark[iRow] = 1;
      workIndex[workCount++] = iRow;
    }
  }

  // 2. See if it worth to try to go sparse
  //    (Many candidates, really sparse RHS)
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
    HighsInt icutoff = max(workCount * 0.001, 500.0);
    double maxMerit = 0;
    for (HighsInt iRow = 0, iPut = 0; iRow < numRow; iRow++)
      if (workMark[iRow]) {
        double myMerit = work_infeasibility[iRow] / edge_weight[iRow];
        if (maxMerit < myMerit) maxMerit = myMerit;
        dwork[iPut++] = -myMerit;
      }
    nth_element(dwork, dwork + icutoff, dwork + workCount);
    double cutMerit = -dwork[icutoff];
    workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

    // Create again
    fill_n(workMark.data(), numRow, 0);
    workCount = 0;
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      if (work_infeasibility[iRow] >= edge_weight[iRow] * workCutoff) {
        workIndex[workCount++] = iRow;
        workMark[iRow] = 1;
      }
    }

    // Reduce by drop smaller
    if (workCount > icutoff * 1.5) {
      // Firstly take up "icutoff" number of elements
      HighsInt fullCount = workCount;
      workCount = icutoff;
      for (HighsInt i = icutoff; i < fullCount; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > edge_weight[iRow] * cutMerit) {
          workIndex[workCount++] = iRow;
        } else {
          workMark[iRow] = 0;
        }
      }
    }
  }

  // 3. If there are still too many candidates: disable them
  if (workCount > 0.2 * numRow) {
    workCount = -numRow;
    workCutoff = 0;
  }
}